

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void Benchmark::fill_vector(double *x,double *y,unsigned_long n)

{
  result_type_conflict rVar1;
  bool bVar2;
  mt19937 e2;
  uniform_real_distribution<double> local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13b0);
  local_13c8._M_param._M_a = 1.0;
  local_13c8._M_param._M_b = 151.0;
  while (bVar2 = n != 0, n = n - 1, bVar2) {
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_13c8,&local_13b0);
    x[n] = rVar1;
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_13c8,&local_13b0);
    y[n] = rVar1;
  }
  return;
}

Assistant:

void
Benchmark::fill_vector(double *x, double *y, unsigned long n)
{
	std::mt19937 e2;
	std::uniform_real_distribution<> dist(1, 151);

	while (n--)
	{
		x[n] = dist(e2);
		y[n] = dist(e2);
	}
}